

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O1

bool __thiscall ON_Hatch::ReplaceLoops(ON_Hatch *this,ON_SimpleArray<const_ON_Curve_*> *loop_curves)

{
  ON_HatchLoop **__s;
  bool bVar1;
  int iVar2;
  ON_Curve *pCurve2d;
  undefined8 extraout_RAX;
  ON_HatchLoop *pOVar3;
  long lVar4;
  bool bVar5;
  ON_Plane *pOVar6;
  ON_Xform *pOVar7;
  ON_Plane *pOVar8;
  ON_Xform *pOVar9;
  long lVar10;
  byte bVar11;
  ON_SimpleArray<ON_HatchLoop_*> loops;
  ON_Plane hplane;
  ON_HatchLoop *loop;
  ON_Xform xf;
  ON_Xform flatxf;
  ON_SimpleArray<ON_HatchLoop_*> local_2e0;
  ulong local_2c8;
  ON_Plane *local_2c0;
  ON_Plane local_2b8;
  ON_Xform local_230;
  ON_Xform local_1b0;
  ON_Xform local_130;
  ON_Xform local_b0;
  
  bVar11 = 0;
  if (loop_curves->m_count < 1) {
    bVar5 = false;
  }
  else {
    ON_Xform::ON_Xform(&local_1b0);
    local_2e0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081f400;
    local_2e0.m_a = (ON_HatchLoop **)0x0;
    local_2e0.m_count = 0;
    local_2e0.m_capacity = 0;
    if (0 < loop_curves->m_count) {
      local_2c0 = &this->m_plane;
      bVar5 = true;
      lVar10 = 0;
      local_2c8 = 0;
      while (loop_curves->m_a[lVar10] != (ON_Curve *)0x0) {
        pCurve2d = ON_Curve::Duplicate(loop_curves->m_a[lVar10]);
        if (pCurve2d == (ON_Curve *)0x0) {
LAB_0049f122:
          bVar5 = false;
          bVar1 = false;
        }
        else {
          iVar2 = (*(pCurve2d->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])(pCurve2d);
          if (iVar2 == 3) {
            if ((local_2c8 & 1) == 0) {
              ON_Xform::ON_Xform(&local_230);
              ON_Xform::ON_Xform(&local_130);
              pOVar6 = &ON_xy_plane;
              pOVar8 = &local_2b8;
              for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
                (pOVar8->origin).x = (pOVar6->origin).x;
                pOVar6 = (ON_Plane *)((long)pOVar6 + ((ulong)bVar11 * -2 + 1) * 8);
                pOVar8 = (ON_Plane *)((long)pOVar8 + (ulong)bVar11 * -0x10 + 8);
              }
              local_2b8.origin.z = (local_2c0->origin).z;
              local_2b8.origin.x = (local_2c0->origin).x;
              local_2b8.origin.y = (local_2c0->origin).y;
              ON_Xform::Rotation(&local_230,local_2c0,&local_2b8);
              ON_Xform::PlanarProjection(&local_130,&local_2b8);
              ON_Xform::operator*(&local_b0,&local_130,&local_230);
              pOVar7 = &local_b0;
              pOVar9 = &local_1b0;
              for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
                pOVar9->m_xform[0][0] = pOVar7->m_xform[0][0];
                pOVar7 = (ON_Xform *)((long)pOVar7 + ((ulong)bVar11 * -2 + 1) * 8);
                pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar11 * -2 + 1) * 8);
              }
              ON_Plane::~ON_Plane(&local_2b8);
              local_2c8 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
            }
            iVar2 = (*(pCurve2d->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(pCurve2d)
            ;
            if (((char)iVar2 == '\0') ||
               (iVar2 = (*(pCurve2d->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])
                                  (pCurve2d), (char)iVar2 == '\0')) {
              (*(pCurve2d->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pCurve2d);
              goto LAB_0049f122;
            }
          }
          pOVar3 = (ON_HatchLoop *)onmalloc(0x10);
          ON_HatchLoop::ON_HatchLoop(pOVar3,pCurve2d,(uint)(local_2e0.m_count != 0));
          local_230.m_xform[0][0] = (double)pOVar3;
          if (pOVar3 == (ON_HatchLoop *)0x0) {
            (*(pCurve2d->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pCurve2d);
          }
          else {
            ON_SimpleArray<ON_HatchLoop_*>::Append(&local_2e0,(ON_HatchLoop **)&local_230);
          }
          bVar1 = true;
        }
        if ((!bVar1) || (lVar10 = lVar10 + 1, loop_curves->m_count <= lVar10)) goto LAB_0049f15f;
      }
      bVar5 = false;
LAB_0049f15f:
      if (!bVar5) {
        if (0 < local_2e0.m_count) {
          lVar10 = 0;
          do {
            pOVar3 = local_2e0.m_a[lVar10];
            if (pOVar3 != (ON_HatchLoop *)0x0) {
              ON_HatchLoop::~ON_HatchLoop(pOVar3);
              onfree(pOVar3);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < local_2e0.m_count);
        }
        if (local_2e0.m_a != (ON_HatchLoop **)0x0) {
          memset(local_2e0.m_a,0,(long)local_2e0.m_capacity << 3);
        }
        local_2e0._16_8_ = local_2e0._16_8_ & 0xffffffff00000000;
      }
    }
    bVar5 = 0 < local_2e0.m_count;
    if (0 < local_2e0.m_count) {
      if (0 < (this->m_loops).m_count) {
        lVar10 = 0;
        do {
          pOVar3 = (this->m_loops).m_a[lVar10];
          if (pOVar3 != (ON_HatchLoop *)0x0) {
            ON_HatchLoop::~ON_HatchLoop(pOVar3);
            onfree(pOVar3);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (this->m_loops).m_count);
      }
      __s = (this->m_loops).m_a;
      if (__s != (ON_HatchLoop **)0x0) {
        memset(__s,0,(long)(this->m_loops).m_capacity << 3);
      }
      (this->m_loops).m_count = 0;
      if (0 < local_2e0.m_count) {
        lVar10 = 0;
        lVar4 = 0;
        do {
          ON_SimpleArray<ON_HatchLoop_*>::Append
                    (&this->m_loops,(ON_HatchLoop **)((long)local_2e0.m_a + lVar10));
          lVar4 = lVar4 + 1;
          lVar10 = lVar10 + 8;
        } while (lVar4 < local_2e0.m_count);
      }
    }
    ON_SimpleArray<ON_HatchLoop_*>::~ON_SimpleArray(&local_2e0);
  }
  return bVar5;
}

Assistant:

bool ON_Hatch::ReplaceLoops(ON_SimpleArray<const ON_Curve*>& loop_curves)
{
  if(loop_curves.Count() < 1)
    return false;

  bool rc = true;
  ON_Xform xf;
  bool flat = false;
  ON_SimpleArray<ON_HatchLoop*> loops;

  for(int i = 0; i < loop_curves.Count(); i++)
  {
    if(loop_curves[i] == 0)
    {
      rc = false;
      break;
    }
    ON_Curve* p2d = loop_curves[i]->Duplicate();
    if(p2d == 0)
    {
      rc = false;
      break;
    }
    if(p2d->Dimension() == 3)
    {
      if(!flat)
      {
        ON_Xform planexf, flatxf;
        ON_Plane hplane(ON_xy_plane);
        hplane.origin = m_plane.origin;
        planexf.Rotation(m_plane, hplane);
        flatxf.PlanarProjection(hplane);
        xf = flatxf * planexf;
        flat = true;
      }
      if(!p2d->Transform(xf) ||
         !p2d->ChangeDimension(2))
      {
        delete p2d;
        rc = false;
        break;
      }
    }
    ON_HatchLoop* loop = new ON_HatchLoop(p2d,loops.Count()?ON_HatchLoop::ltInner:ON_HatchLoop::ltOuter);
    if(loop)
      loops.Append(loop);
    else
      delete p2d;
  }
  if(!rc)
  {
    for(int i = 0; i < loops.Count(); i++)
      delete loops[i];

    loops.Empty();
  }

  if(loops.Count() < 1)
    return false;

  for(int i = 0; i < m_loops.Count(); i++)
    delete m_loops[i];
  m_loops.Empty();
  for(int i = 0; i < loops.Count(); i++)
    m_loops.Append(loops[i]);
  return true;
}